

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

int32_t __thiscall
icu_63::RuleBasedBreakIterator::following(RuleBasedBreakIterator *this,int32_t startPos)

{
  uint in_EAX;
  int iVar1;
  int64_t iVar2;
  UErrorCode status;
  undefined8 uStack_18;
  
  if (-1 < startPos) {
    uStack_18._0_4_ = in_EAX;
    utext_setNativeIndex_63(&this->fText,(ulong)(uint)startPos);
    iVar2 = utext_getNativeIndex_63(&this->fText);
    uStack_18 = (ulong)(uint)uStack_18;
    BreakCache::following(this->fBreakCache,(int32_t)iVar2,(UErrorCode *)((long)&uStack_18 + 4));
    return -(uint)(this->fDone != '\0') | this->fPosition;
  }
  iVar1 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[10])(this);
  return iVar1;
}

Assistant:

int32_t RuleBasedBreakIterator::following(int32_t startPos) {
    // if the supplied position is before the beginning, return the
    // text's starting offset
    if (startPos < 0) {
        return first();
    }

    // Move requested offset to a code point start. It might be on a trail surrogate,
    // or on a trail byte if the input is UTF-8. Or it may be beyond the end of the text.
    utext_setNativeIndex(&fText, startPos);
    startPos = (int32_t)utext_getNativeIndex(&fText);

    UErrorCode status = U_ZERO_ERROR;
    fBreakCache->following(startPos, status);
    return fDone ? UBRK_DONE : fPosition;
}